

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union.c
# Opt level: O3

LY_ERR lyplg_type_store_union
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node,
                 lyd_value *storage,lys_glob_unres *unres,ly_err_item **err)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lyd_value_union *subvalue;
  size_t sVar4;
  uint *puVar5;
  char *err_format;
  LY_ERR ret__;
  uint type_idx;
  uint32_t local_4c;
  ly_ctx *local_48;
  uint *local_40;
  lysc_type_union *local_38;
  
  *err = (ly_err_item *)0x0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  local_4c = options;
  local_48 = ctx;
  local_40 = (uint *)value;
  subvalue = (lyd_value_union *)calloc(1,0x50);
  puVar5 = local_40;
  (storage->field_2).subvalue = subvalue;
  LVar1 = LY_EMEM;
  if (subvalue == (lyd_value_union *)0x0) goto LAB_001bc1eb;
  storage->realtype = type;
  subvalue->hints = hints;
  subvalue->ctx_node = ctx_node;
  if (format == LY_VALUE_LYB) {
    if (value_len < 4) {
      err_format = "Invalid LYB union value size %zu (expected at least 4).";
      sVar4 = value_len;
LAB_001bc134:
      LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,err_format,sVar4);
      puVar5 = local_40;
      if (LVar2 == LY_SUCCESS) {
        if (local_40 == (uint *)0x0) {
          __assert_fail("lyb_data && !(lyb_value && !lyb_value_len)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/union.c"
                        ,0x84,
                        "void lyb_parse_union(const void *, size_t, uint32_t *, const void **, size_t *)"
                       );
        }
        type_idx = *local_40;
        if (value_len != 0) goto LAB_001bc188;
        local_38 = (lysc_type_union *)type;
        LVar2 = union_subvalue_assignment
                          (local_40,0,&subvalue->original,&subvalue->orig_len,&local_4c);
        if (LVar2 != LY_SUCCESS) goto LAB_001bc1eb;
        subvalue->format = LY_VALUE_LYB;
        goto LAB_001bc2d1;
      }
    }
    else {
      type_idx = *local_40;
      sVar4 = (size_t)type_idx;
      if ((type[1].name == (char *)0x0) || (*(ulong *)(type[1].name + -8) <= sVar4)) {
        err_format = "Invalid LYB union type index %lu (type count %lu).";
        goto LAB_001bc134;
      }
LAB_001bc188:
      puVar5 = local_40;
      if (value_len == 4) {
        local_38 = (lysc_type_union *)type;
        LVar2 = union_subvalue_assignment
                          (local_40,4,&subvalue->original,&subvalue->orig_len,&local_4c);
        if (LVar2 != LY_SUCCESS) goto LAB_001bc1eb;
        puVar5 = (uint *)0x1d59b8;
        sVar4 = 0;
      }
      else {
        local_38 = (lysc_type_union *)type;
        LVar2 = union_subvalue_assignment
                          (local_40,value_len,&subvalue->original,&subvalue->orig_len,&local_4c);
        if (LVar2 != LY_SUCCESS) goto LAB_001bc1eb;
        sVar4 = value_len - 4;
        puVar5 = puVar5 + 1;
      }
      LVar2 = lyplg_type_prefix_data_new
                        (local_48,puVar5,sVar4,LY_VALUE_LYB,prefix_data,&subvalue->format,
                         &subvalue->prefix_data);
      if (LVar2 == LY_SUCCESS) {
        if (subvalue->format != LY_VALUE_LYB) {
          __assert_fail("subvalue->format == LY_VALUE_LYB",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/union.c"
                        ,0x171,
                        "LY_ERR lyb_fill_subvalue(const struct ly_ctx *, struct lysc_type_union *, const void *, size_t, void *, struct lyd_value_union *, uint32_t *, struct lys_glob_unres *, struct ly_err_item **)"
                       );
        }
LAB_001bc2d1:
        LVar2 = union_store_type(local_48,local_38,type_idx,subvalue,local_4c,'\0',(lyd_node *)0x0,
                                 (lyd_node *)0x0,unres,err);
      }
    }
    puVar5 = local_40;
    if ((LVar2 != LY_SUCCESS) && (LVar1 = LVar2, LVar2 != LY_EINCOMPLETE)) goto LAB_001bc1eb;
  }
  else {
    local_4c = options & 0xfffffff7;
    local_38 = (lysc_type_union *)type;
    LVar2 = union_subvalue_assignment
                      (local_40,value_len,&subvalue->original,&subvalue->orig_len,&local_4c);
    if (((LVar2 != LY_SUCCESS) ||
        (LVar1 = lyplg_type_prefix_data_new
                           (local_48,puVar5,value_len,format,prefix_data,&subvalue->format,
                            &subvalue->prefix_data), LVar1 != LY_SUCCESS)) ||
       ((LVar2 = union_find_type(local_48,local_38,subvalue,local_4c,'\0',(lyd_node *)0x0,
                                 (lyd_node *)0x0,(uint32_t *)0x0,unres,err), LVar2 != LY_EINCOMPLETE
        && (LVar1 = LVar2, LVar2 != LY_SUCCESS)))) goto LAB_001bc1eb;
  }
  LVar3 = lydict_insert(local_48,(subvalue->value)._canonical,0,&storage->_canonical);
  LVar1 = LVar2;
  if (LVar3 != LY_SUCCESS) {
    LVar1 = LVar3;
  }
LAB_001bc1eb:
  if ((local_4c & 1) != 0) {
    free(puVar5);
  }
  if ((LVar1 != LY_SUCCESS) && (LVar1 != LY_EINCOMPLETE)) {
    lyplg_type_free_union(local_48,storage);
  }
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_union(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node,
        struct lyd_value *storage, struct lys_glob_unres *unres, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lysc_type_union *type_u = (struct lysc_type_union *)type;
    struct lyd_value_union *subvalue;

    *err = NULL;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, subvalue);
    LY_CHECK_ERR_GOTO(!subvalue, ret = LY_EMEM, cleanup);
    storage->realtype = type;
    subvalue->hints = hints;
    subvalue->ctx_node = ctx_node;

    if (format == LY_VALUE_LYB) {
        ret = lyb_fill_subvalue(ctx, type_u, value, value_len, prefix_data, subvalue, &options, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    } else {
        /* to correctly resolve the union type, we need to always validate the value */
        options &= ~LYPLG_TYPE_STORE_ONLY;

        /* store value to subvalue */
        ret = union_subvalue_assignment(value, value_len, &subvalue->original, &subvalue->orig_len, &options);
        LY_CHECK_GOTO(ret, cleanup);

        /* store format-specific data for later prefix resolution */
        ret = lyplg_type_prefix_data_new(ctx, value, value_len, format, prefix_data, &subvalue->format,
                &subvalue->prefix_data);
        LY_CHECK_GOTO(ret, cleanup);

        /* use the first usable subtype to store the value */
        ret = union_find_type(ctx, type_u, subvalue, options, 0, NULL, NULL, NULL, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    }

    /* store canonical value, if any (use the specific type value) */
    r = lydict_insert(ctx, subvalue->value._canonical, 0, &storage->_canonical);
    LY_CHECK_ERR_GOTO(r, ret = r, cleanup);

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if ((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE)) {
        lyplg_type_free_union(ctx, storage);
    }
    return ret;
}